

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  cmMakefile *mf;
  pointer pcVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  size_t sVar7;
  ostream *poVar8;
  pointer pbVar9;
  int iVar10;
  size_type sVar11;
  pointer ppVar12;
  WrapQuotes in_R8D;
  string *arg;
  pointer pbVar13;
  string_view str;
  string equalSigns;
  string exe;
  string local_c0;
  cmTestGenerator *local_a0;
  int local_94;
  string local_90;
  string local_70;
  pointer local_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  this->TestGenerated = true;
  pcVar2 = this->Test;
  mf = pcVar2->Makefile;
  pcVar3 = (pcVar2->Name)._M_dataplus._M_p;
  local_a0 = this;
  local_94 = indent.Level;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + (pcVar2->Name)._M_string_length);
  bVar6 = anon_unknown.dwarf_9b6ee2::needToQuoteTestName(mf,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar3 = (local_a0->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (local_a0->Test->Name)._M_string_length);
  sVar7 = anon_unknown.dwarf_9b6ee2::countMaxConsecutiveEqualSigns(&local_70);
  iVar10 = local_94;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)sVar7 + '\x01');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_a0->Test;
  pbVar4 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar3 = (pbVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + pbVar4->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
  if (bVar6) {
    if (0 < iVar10) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"add_test([",10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    pcVar3 = (local_a0->Test->Name)._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,pcVar3 + (local_a0->Test->Name)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] \"",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_0028c81b;
  }
  else {
    if (0 < iVar10) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"add_test(",9);
    pcVar3 = (local_a0->Test->Name)._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,pcVar3 + (local_a0->Test->Name)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," \"",2);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_0028c81b;
  }
  operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
LAB_0028c81b:
  pbVar13 = (pcVar2->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = pbVar13 + 1;
  if (pbVar4 != local_50) {
    do {
      pbVar9 = pbVar4;
      std::__ostream_insert<char,std::char_traits<char>>(fout," \"",2);
      sVar5 = pbVar13[1]._M_string_length;
      if (sVar5 != 0) {
        pcVar3 = (pbVar9->_M_dataplus)._M_p;
        sVar11 = 0;
        do {
          cVar1 = pcVar3[sVar11];
          if (cVar1 == '\"') {
            local_c0._M_dataplus._M_p._0_1_ = 0x5c;
            std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_c0,1);
          }
          local_c0._M_dataplus._M_p._0_1_ = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_c0,1);
          sVar11 = sVar11 + 1;
        } while (sVar5 != sVar11);
      }
      local_c0._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_c0,1);
      pbVar4 = pbVar9 + 1;
      pbVar13 = pbVar9;
    } while (pbVar9 + 1 != local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,")\n",2);
  if (bVar6) {
    iVar10 = local_94;
    if (0 < local_94) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"set_tests_properties([",0x16);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    pcVar3 = (local_a0->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,pcVar3 + (local_a0->Test->Name)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] PROPERTIES ",0xd);
  }
  else {
    iVar10 = local_94;
    if (0 < local_94) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"set_tests_properties(",0x15);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    pcVar3 = (local_a0->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,pcVar3 + (local_a0->Test->Name)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," PROPERTIES ",0xc);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  cmPropertyMap::GetList_abi_cxx11_(&local_48,&local_a0->Test->Properties);
  if (local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar12 = local_48.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (fout,(ppVar12->first)._M_dataplus._M_p,(ppVar12->first)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      str._M_str = (char *)0x0;
      str._M_len = (size_t)(ppVar12->second)._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_c0,(cmOutputConverter *)(ppVar12->second)._M_string_length,str,in_R8D);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 !=
             local_48.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  GenerateInternalProperties(local_a0,fout);
  std::__ostream_insert<char,std::char_traits<char>>(fout,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout, Indent indent)
{
  this->TestGenerated = true;

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  if (quote_test_name) {
    fout << indent << "add_test([" << equalSigns << "["
         << this->Test->GetName() << "]" << equalSigns << "] \"" << exe
         << "\"";
  } else {
    fout << indent << "add_test(" << this->Test->GetName() << " \"" << exe
         << "\"";
  }

  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for (char c : arg) {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if (c == '"') {
        fout << '\\';
      }
      fout << c;
    }
    fout << '"';
  }
  fout << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    fout << indent << "set_tests_properties([" << equalSigns << "["
         << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    fout << indent << "set_tests_properties(" << this->Test->GetName()
         << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    fout << " " << i.first << " "
         << cmOutputConverter::EscapeForCMake(i.second);
  }
  this->GenerateInternalProperties(fout);
  fout << ")\n";
}